

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::handleLoopAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  _func_int **pp_Var7;
  char *pcVar8;
  undefined8 *puVar9;
  uint uiValue;
  int value;
  anon_class_16_2_3fe397bd spirv14;
  anon_class_24_3_97e273f6 unsignedArgument;
  anon_class_24_3_97e273f6 noArgument;
  uint local_94;
  const_iterator local_90;
  TIntermNode *local_88;
  int local_80;
  int local_7c;
  anon_class_16_2_3fe397bd local_78;
  anon_class_24_3_97e273f6 local_68;
  _List_node_base *local_50;
  anon_class_24_3_97e273f6 local_48;
  undefined4 extraout_var_01;
  
  local_88 = node;
  iVar2 = (*node->_vptr_TIntermNode[0xe])(node);
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 == 0) {
    iVar2 = (*node->_vptr_TIntermNode[6])(node);
    plVar3 = (long *)CONCAT44(extraout_var_01,iVar2);
    if (plVar3 == (long *)0x0) {
      return;
    }
    lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
    puVar9 = *(undefined8 **)(lVar4 + 8);
    do {
      lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
      if (puVar9 == *(undefined8 **)(lVar4 + 0x10)) {
        return;
      }
      lVar4 = (**(code **)(*(long *)*puVar9 + 0x70))();
      puVar9 = puVar9 + 1;
    } while (lVar4 == 0);
  }
  local_90._M_node =
       &(attributes->
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node.super__List_node_base;
  local_50 = local_90._M_node;
LAB_0036b4ef:
  local_78.node = &local_88;
  local_90._M_node = ((_List_node_base *)&(local_90._M_node)->_M_next)->_M_next;
  if (local_90._M_node == local_50) {
    return;
  }
  local_80 = 0;
  local_94 = 0;
  local_78.this = this;
  local_68.it = &local_90;
  local_68.this = this;
  local_68.node = local_78.node;
  local_48.it = &local_90;
  local_48.this = this;
  local_48.node = local_78.node;
  switch(*(undefined4 *)&local_90._M_node[1]._M_next) {
  case 0x12:
    bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()(&local_48,"unroll");
    if (bVar1) {
      *(undefined1 *)(lVar4 + 0x39) = 1;
    }
    goto LAB_0036b4ef;
  case 0x13:
    bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()(&local_48,"dont_unroll");
    if (bVar1) {
      *(undefined1 *)(lVar4 + 0x3a) = 1;
      *(undefined8 *)(lVar4 + 0x4c) = 0;
    }
    goto LAB_0036b4ef;
  default:
    iVar2 = (**local_88->_vptr_TIntermNode)();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,CONCAT44(extraout_var_00,iVar2),"attribute does not apply to a loop","","");
    goto LAB_0036b4ef;
  case 0x1b:
    bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                      (&local_48,"dependency_infinite");
    if (bVar1) {
      *(undefined4 *)(lVar4 + 0x3c) = 0xffffffff;
    }
    goto LAB_0036b4ef;
  case 0x1c:
    iVar2 = TAttributeArgs::size((TAttributeArgs *)(local_90._M_node + 1));
    lVar6 = 0x170;
    if (iVar2 == 1) {
      bVar1 = TAttributeArgs::getInt((TAttributeArgs *)(local_90._M_node + 1),&local_80,0);
      pcVar8 = "expected a single integer argument";
      if (bVar1) {
        if (0 < local_80) {
          *(int *)(lVar4 + 0x3c) = local_80;
          goto LAB_0036b4ef;
        }
        lVar6 = 0x168;
        pcVar8 = "must be positive";
      }
    }
    else {
      pcVar8 = "expected a single integer argument";
    }
    iVar2 = (**local_88->_vptr_TIntermNode)();
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = "dependency_length";
    break;
  case 0x1d:
    handleLoopAttributes::anon_class_16_2_3fe397bd::operator()(&local_78,"min_iterations");
    bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                      (&local_68,"min_iterations",&local_94);
    if (bVar1) {
      *(uint *)(lVar4 + 0x40) = local_94;
    }
    goto LAB_0036b4ef;
  case 0x1e:
    handleLoopAttributes::anon_class_16_2_3fe397bd::operator()(&local_78,"max_iterations");
    bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                      (&local_68,"max_iterations",&local_94);
    if (bVar1) {
      *(uint *)(lVar4 + 0x44) = local_94;
    }
    goto LAB_0036b4ef;
  case 0x1f:
    handleLoopAttributes::anon_class_16_2_3fe397bd::operator()(&local_78,"iteration_multiple");
    iVar2 = TAttributeArgs::size((TAttributeArgs *)(local_90._M_node + 1));
    lVar6 = 0x170;
    if (iVar2 == 1) {
      bVar1 = TAttributeArgs::getInt((TAttributeArgs *)(local_90._M_node + 1),&local_7c,0);
      pcVar8 = "expected a single integer argument";
      if (bVar1) {
        if (local_7c != 0) {
          *(int *)(lVar4 + 0x48) = local_7c;
          goto LAB_0036b4ef;
        }
        lVar6 = 0x168;
        pcVar8 = "must be greater than or equal to 1";
      }
    }
    else {
      pcVar8 = "expected a single integer argument";
    }
    iVar2 = (**local_88->_vptr_TIntermNode)();
    pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = "iteration_multiple";
    break;
  case 0x20:
    handleLoopAttributes::anon_class_16_2_3fe397bd::operator()(&local_78,"peel_count");
    bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                      (&local_68,"peel_count",&local_94);
    if (bVar1) {
      *(uint *)(lVar4 + 0x4c) = local_94;
      goto LAB_0036b760;
    }
    goto LAB_0036b4ef;
  case 0x21:
    goto switchD_0036b54a_caseD_21;
  }
  (**(code **)((long)pp_Var7 + lVar6))(this,iVar2,pcVar8,pcVar5,"");
  goto LAB_0036b4ef;
switchD_0036b54a_caseD_21:
  handleLoopAttributes::anon_class_16_2_3fe397bd::operator()(&local_78,"partial_count");
  bVar1 = handleLoopAttributes::anon_class_24_3_97e273f6::operator()
                    (&local_68,"partial_count",&local_94);
  if (bVar1) {
    *(uint *)(lVar4 + 0x50) = local_94;
LAB_0036b760:
    *(undefined1 *)(lVar4 + 0x3a) = 0;
  }
  goto LAB_0036b4ef;
}

Assistant:

void TParseContext::handleLoopAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermLoop* loop = node->getAsLoopNode();
    if (loop == nullptr) {
        // the actual loop might be part of a sequence
        TIntermAggregate* agg = node->getAsAggregate();
        if (agg == nullptr)
            return;
        for (auto it = agg->getSequence().begin(); it != agg->getSequence().end(); ++it) {
            loop = (*it)->getAsLoopNode();
            if (loop != nullptr)
                break;
        }
        if (loop == nullptr)
            return;
    }

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {

        const auto noArgument = [&](const char* feature) {
            if (it->size() > 0) {
                warn(node->getLoc(), "expected no arguments", feature, "");
                return false;
            }
            return true;
        };

        const auto positiveSignedArgument = [&](const char* feature, int& value) {
            if (it->size() == 1 && it->getInt(value)) {
                if (value <= 0) {
                    error(node->getLoc(), "must be positive", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            return true;
        };

        const auto unsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (!(it->size() == 1 && it->getInt(value))) {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto positiveUnsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (it->size() == 1 && it->getInt(value)) {
                if (value == 0) {
                    error(node->getLoc(), "must be greater than or equal to 1", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto spirv14 = [&](const char* feature) {
            if (spvVersion.spv > 0 && spvVersion.spv < EShTargetSpv_1_4)
                warn(node->getLoc(), "attribute requires a SPIR-V 1.4 target-env", feature, "");
        };

        int value = 0;
        unsigned uiValue = 0;
        switch (it->name) {
        case EatUnroll:
            if (noArgument("unroll"))
                loop->setUnroll();
            break;
        case EatLoop:
            if (noArgument("dont_unroll"))
                loop->setDontUnroll();
            break;
        case EatDependencyInfinite:
            if (noArgument("dependency_infinite"))
                loop->setLoopDependency(TIntermLoop::dependencyInfinite);
            break;
        case EatDependencyLength:
            if (positiveSignedArgument("dependency_length", value))
                loop->setLoopDependency(value);
            break;
        case EatMinIterations:
            spirv14("min_iterations");
            if (unsignedArgument("min_iterations", uiValue))
                loop->setMinIterations(uiValue);
            break;
        case EatMaxIterations:
            spirv14("max_iterations");
            if (unsignedArgument("max_iterations", uiValue))
                loop->setMaxIterations(uiValue);
            break;
        case EatIterationMultiple:
            spirv14("iteration_multiple");
            if (positiveUnsignedArgument("iteration_multiple", uiValue))
                loop->setIterationMultiple(uiValue);
            break;
        case EatPeelCount:
            spirv14("peel_count");
            if (unsignedArgument("peel_count", uiValue))
                loop->setPeelCount(uiValue);
            break;
        case EatPartialCount:
            spirv14("partial_count");
            if (unsignedArgument("partial_count", uiValue))
                loop->setPartialCount(uiValue);
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a loop", "", "");
            break;
        }
    }
}